

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

int get_physical_address
              (CPURISCVState_conflict1 *env,hwaddr *physical,int *prot,target_ulong addr,
              int access_type,int mmu_idx,_Bool first_stage,_Bool two_stage)

{
  byte bVar1;
  char cVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  MemoryRegion_conflict *pMVar8;
  uint64_t *puVar9;
  bool bVar10;
  uint uVar11;
  target_ulong *ptVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  target_ulong addr_00;
  int iVar17;
  long lVar18;
  ulong uVar19;
  MemTxAttrs attrs;
  bool bVar20;
  int local_e0;
  target_ulong local_c0;
  hwaddr vbase;
  uint local_a4;
  int local_a0;
  MemTxResult res;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  uint64_t local_80;
  ulong local_78;
  hwaddr *local_70;
  ulong local_68;
  undefined8 local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  hwaddr addr1;
  
  if (access_type == 2 || mmu_idx != 3) {
    uVar16 = 0;
    local_a4 = mmu_idx;
  }
  else {
    uVar16 = env->mstatus;
    if (((uint)uVar16 >> 0x11 & 1) == 0) {
      local_a4 = 3;
    }
    else {
      local_a4 = (uint)(uVar16 >> 0xb) & 3;
      if ((env->misa & 0x80) != 0) {
        uVar16 = uVar16 >> 0x27;
        goto LAB_00c73e51;
      }
    }
    uVar16 = 0;
  }
LAB_00c73e51:
  if ((((access_type != 2) && (local_a4 == 1)) && (local_a4 = 1, (env->misa & 0x80) != 0)) &&
     (((env->virt & 1) == 0 && ((env->hstatus & 1) != 0)))) {
    local_a4 = (uint)env->mstatus >> 8 & 1;
    uVar16 = 1;
  }
  iVar4 = 0;
  if (!first_stage) {
    local_a4 = 0;
  }
  if ((local_a4 == 3) || ((env->features & 1) == 0)) {
LAB_00c73eae:
    *physical = addr;
    *prot = 7;
  }
  else {
    ptVar12 = &env->vsstatus;
    if (first_stage) {
      ptVar12 = &env->mstatus;
    }
    *prot = 0;
    if (0x10fff < env->priv_ver) {
      lVar13 = 0x2a0;
      if ((uVar16 & 1) != 0) {
        lVar13 = 0x368;
      }
      lVar18 = 0x328;
      if (first_stage) {
        lVar18 = lVar13;
      }
      uVar16 = *(ulong *)((long)env->gpr + lVar18);
      if ((uint)(uVar16 >> 0x3c) < 0xb) {
        iVar4 = (*(code *)(&DAT_00dc48cc + *(int *)(&DAT_00dc48cc + (uVar16 >> 0x3c) * 4)))
                          (&DAT_00dc48cc + *(int *)(&DAT_00dc48cc + (uVar16 >> 0x3c) * 4));
        return iVar4;
      }
      iVar4 = 0x17f;
      goto LAB_00c7446b;
    }
    local_c0 = env->sptbr << 0xc;
    uVar6 = (uint)env->mstatus;
    uVar11 = uVar6 >> 0x18 & 0x1f;
    if (uVar11 < 9) {
      if (uVar11 == 0) goto LAB_00c73eae;
      if (uVar11 != 8) {
LAB_00c73fe3:
        iVar4 = 0x192;
LAB_00c7446b:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                   ,iVar4,(char *)0x0);
      }
      local_60 = 2;
      iVar4 = 10;
      lVar13 = 4;
    }
    else {
      if (uVar11 == 10) {
        local_60 = 4;
      }
      else {
        if (uVar11 != 9) goto LAB_00c73fe3;
        local_60 = 3;
      }
      iVar4 = 9;
      lVar13 = 8;
    }
    cVar2 = (char)local_60 * (sbyte)iVar4;
    uVar16 = ~(-1L << (0x35U - cVar2 & 0x3f));
    uVar19 = addr >> (cVar2 + 0xbU & 0x3f) & uVar16;
    if (uVar19 == 0 || uVar19 == uVar16) {
      uVar11 = (uint)*ptVar12 >> 0x13;
      uVar14 = ((int)local_60 + -1) * iVar4;
      bVar10 = access_type == 2 || (uVar6 >> 0x12 & 1) != 0;
      local_90 = (ulong)bVar10;
      local_68 = (ulong)(access_type == 1) << 7 | 0x40;
      local_78 = addr >> 0xc;
      iVar17 = 0;
      local_a0 = mmu_idx;
      local_70 = physical;
      local_58 = addr;
      do {
        local_48 = (ulong)uVar14;
        bVar1 = (byte)uVar14;
        local_40 = local_58 >> (bVar1 + 0xc & 0x3f);
        local_88 = ~(-1L << (bVar1 & 0x3f));
        local_50 = ~(-1L << (bVar1 & 0x3f));
        do {
          iVar5 = iVar17;
          uVar16 = (ulong)(~(-1 << (sbyte)iVar4) & (uint)local_40);
          if (first_stage && two_stage) {
            get_physical_address(env,&vbase,prot,local_c0,access_type,local_a0,false,true);
            addr_00 = uVar16 * lVar13 + vbase;
          }
          else {
            addr_00 = uVar16 * lVar13 + local_c0;
          }
          if ((env->features & 2) != 0) {
            _Var3 = pmp_hart_has_privs_riscv64((CPURISCVState_conflict2 *)env,addr_00,8,PMP_READ,1);
            if (_Var3) goto LAB_00c741c0;
            local_e0 = 2;
            iVar15 = 1;
            goto LAB_00c74210;
          }
LAB_00c741c0:
          iVar17 = 1;
          uVar7 = address_space_ldq_riscv64
                            ((uc_struct_conflict13 *)((AddressSpace *)env[-0x17].gpr[0x1d])->uc,
                             (AddressSpace *)env[-0x17].gpr[0x1d],addr_00,(MemTxAttrs)0x1,&res);
          if ((res == 0) && ((uVar7 & 1) != 0)) {
            uVar6 = (uint)uVar7 & 0xe;
            if ((uVar6 == 0xc) || (uVar6 == 4)) goto LAB_00c741f6;
            uVar16 = uVar7 >> 10;
            if ((uVar7 & 0xe) == 0) {
              local_c0 = uVar16 << 0xc;
              iVar15 = 0;
            }
            else {
              if (((((((bVar10 & (byte)(((uint)uVar7 & 0x10) >> 4) & local_a4 != 0) != 0) ||
                     (local_a4 != 1 && (uVar7 & 0x10) == 0)) || ((uVar16 & local_88) != 0)) ||
                   (((access_type == 0 && ((uVar7 & 2) == 0)) &&
                    (((uVar7 & 8) == 0 || ((uVar11 & 1) == 0)))))) ||
                  ((access_type == 1 && ((uVar7 & 4) == 0)))) ||
                 ((access_type == 2 && ((uVar7 & 8) == 0)))) goto LAB_00c741f6;
              if ((local_68 | uVar7) != uVar7) {
                vbase = 8;
                attrs = (MemTxAttrs)(((uint)local_90 & 0xff800000) + 1);
                local_90 = (ulong)(uint)attrs;
                local_98 = uVar16;
                local_80 = local_68 | uVar7;
                pMVar8 = flatview_translate_riscv64
                                   (*(uc_struct_conflict13 **)(env[-0x17].gpr[0x1d] + 0x30),
                                    *(FlatView **)(env[-0x17].gpr[0x1d] + 8),addr_00,&addr1,&vbase,
                                    false,attrs);
                iVar15 = 1;
                if (pMVar8->ram == true) {
                  puVar9 = (uint64_t *)
                           qemu_map_ram_ptr_riscv64
                                     ((uc_struct_conflict13 *)pMVar8->uc,pMVar8->ram_block,addr1);
                  LOCK();
                  bVar20 = uVar7 == *puVar9;
                  if (bVar20) {
                    *puVar9 = local_80;
                  }
                  UNLOCK();
                  if (bVar20) {
                    uVar7 = local_80;
                  }
                  iVar15 = (uint)!bVar20 << 3;
                }
                else {
                  local_e0 = 1;
                }
                uVar16 = local_98;
                if (iVar15 != 0) goto LAB_00c74210;
              }
              uVar19 = local_88;
              if (iVar5 == 0) {
                uVar19 = local_50;
              }
              *local_70 = (uVar16 | uVar19 & local_78) << 0xc;
              if (((uVar7 & 2) != 0) || (((uVar7 & 8) != 0 && ((uVar11 & 1) != 0)))) {
                *(byte *)prot = (byte)*prot | 1;
              }
              if ((uVar7 & 8) != 0) {
                *(byte *)prot = (byte)*prot | 4;
              }
              local_e0 = 0;
              iVar15 = iVar17;
              if (((uVar7 & 4) != 0) && ((access_type == 1 || ((uVar7 & 0x80) != 0)))) {
                *(byte *)prot = (byte)*prot | 2;
              }
            }
          }
          else {
LAB_00c741f6:
            local_e0 = 1;
            iVar15 = iVar17;
          }
LAB_00c74210:
          iVar17 = 0;
        } while (iVar15 == 8);
        if (iVar15 != 0) {
          return local_e0;
        }
        iVar17 = iVar5 + 1;
        uVar14 = (int)local_48 - iVar4;
      } while (iVar17 != (int)local_60);
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int get_physical_address(CPUM68KState *env, hwaddr *physical,
                                int *prot, target_ulong address,
                                int access_type, target_ulong *page_size)
{
    CPUState *cs = env_cpu(env);
    uint32_t entry;
    uint32_t next;
    target_ulong page_mask;
    bool debug = access_type & ACCESS_DEBUG;
    int page_bits;
    int i;
    MemTxResult txres;

    /* Transparent Translation (physical = logical) */
    for (i = 0; i < M68K_MAX_TTR; i++) {
        if (check_TTR(env->mmu.TTR(access_type, i),
                      prot, address, access_type)) {
            if (access_type & ACCESS_PTEST) {
                /* Transparent Translation Register bit */
                env->mmu.mmusr = M68K_MMU_T_040 | M68K_MMU_R_040;
            }
            *physical = address & TARGET_PAGE_MASK;
            *page_size = TARGET_PAGE_SIZE;
            return 0;
        }
    }

    /* Page Table Root Pointer */
    *prot = PAGE_READ | PAGE_WRITE;
    if (access_type & ACCESS_CODE) {
        *prot |= PAGE_EXEC;
    }
    if (access_type & ACCESS_SUPER) {
        next = env->mmu.srp;
    } else {
        next = env->mmu.urp;
    }

    /* Root Index */
    entry = M68K_POINTER_BASE(next) | M68K_ROOT_INDEX(address);

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }
    if (!M68K_UDT_VALID(next)) {
        return -1;
    }
    if (!(next & M68K_DESC_USED) && !debug) {
        glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                          MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (next & M68K_DESC_WRITEPROT) {
        if (access_type & ACCESS_PTEST) {
            env->mmu.mmusr |= M68K_MMU_WP_040;
        }
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }

    /* Pointer Index */
    entry = M68K_POINTER_BASE(next) | M68K_POINTER_INDEX(address);

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }
    if (!M68K_UDT_VALID(next)) {
        return -1;
    }
    if (!(next & M68K_DESC_USED) && !debug) {
        glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                          MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (next & M68K_DESC_WRITEPROT) {
        if (access_type & ACCESS_PTEST) {
            env->mmu.mmusr |= M68K_MMU_WP_040;
        }
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }

    /* Page Index */
    if (env->mmu.tcr & M68K_TCR_PAGE_8K) {
        entry = M68K_8K_PAGE_BASE(next) | M68K_8K_PAGE_INDEX(address);
    } else {
        entry = M68K_4K_PAGE_BASE(next) | M68K_4K_PAGE_INDEX(address);
    }

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }

    if (!M68K_PDT_VALID(next)) {
        return -1;
    }
    if (M68K_PDT_INDIRECT(next)) {
        next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, M68K_INDIRECT_POINTER(next),
                                 MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (access_type & ACCESS_STORE) {
        if (next & M68K_DESC_WRITEPROT) {
            if (!(next & M68K_DESC_USED) && !debug) {
                glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                                  MEMTXATTRS_UNSPECIFIED, &txres);
                if (txres != MEMTX_OK) {
                    goto txfail;
                }
            }
        } else if ((next & (M68K_DESC_MODIFIED | M68K_DESC_USED)) !=
                           (M68K_DESC_MODIFIED | M68K_DESC_USED) && !debug) {
            glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry,
                              next | (M68K_DESC_MODIFIED | M68K_DESC_USED),
                              MEMTXATTRS_UNSPECIFIED, &txres);
            if (txres != MEMTX_OK) {
                goto txfail;
            }
        }
    } else {
        if (!(next & M68K_DESC_USED) && !debug) {
            glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                              MEMTXATTRS_UNSPECIFIED, &txres);
            if (txres != MEMTX_OK) {
                goto txfail;
            }
        }
    }

    if (env->mmu.tcr & M68K_TCR_PAGE_8K) {
        page_bits = 13;
    } else {
        page_bits = 12;
    }
    *page_size = 1 << page_bits;
    page_mask = ~(*page_size - 1);
    *physical = next & page_mask;

    if (access_type & ACCESS_PTEST) {
        env->mmu.mmusr |= next & M68K_MMU_SR_MASK_040;
        env->mmu.mmusr |= *physical & 0xfffff000;
        env->mmu.mmusr |= M68K_MMU_R_040;
    }

    if (next & M68K_DESC_WRITEPROT) {
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }
    if (next & M68K_DESC_SUPERONLY) {
        if ((access_type & ACCESS_SUPER) == 0) {
            return -1;
        }
    }

    return 0;

txfail:
    /*
     * A page table load/store failed. TODO: we should really raise a
     * suitable guest fault here if this is not a debug access.
     * For now just return that the translation failed.
     */
    return -1;
}